

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O2

bool __thiscall Boards::Put(Boards *this,int x,int y,int turn)

{
  bool bVar1;
  bool bVar2;
  
  if ((this->board)._M_elems[x]._M_elems[y] == 0) {
    bVar1 = isPutable(this,x,y,1,0,turn);
    if (bVar1) {
      Reverse(this,x,y,1,0,turn);
    }
    bVar2 = isPutable(this,x,y,0,1,turn);
    if (bVar2) {
      Reverse(this,x,y,0,1,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,-1,0,turn);
    if (bVar2) {
      Reverse(this,x,y,-1,0,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,0,-1,turn);
    if (bVar2) {
      Reverse(this,x,y,0,-1,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,1,1,turn);
    if (bVar2) {
      Reverse(this,x,y,1,1,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,-1,-1,turn);
    if (bVar2) {
      Reverse(this,x,y,-1,-1,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,1,-1,turn);
    if (bVar2) {
      Reverse(this,x,y,1,-1,turn);
      bVar1 = true;
    }
    bVar2 = isPutable(this,x,y,-1,1,turn);
    if (bVar2) {
      Reverse(this,x,y,-1,1,turn);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Boards::Put(int x, int y, int turn){
	bool ret = false;
	if(board[x][y] != 0) return ret;//1 white -1 black
	if(isPutable(x, y, 1, 0, turn)){
		Reverse(x, y, 1, 0, turn);
		ret = true;
	}    //右
	if(isPutable(x, y, 0, 1, turn)){
		Reverse(x, y, 0, 1, turn);
		ret = true;
	}    //下
	if(isPutable(x, y, -1, 0, turn)){
		Reverse(x, y, -1, 0, turn);
		ret = true;
	}    //左
	if(isPutable(x, y, 0, -1, turn)){
		Reverse(x, y, 0, -1, turn);
		ret = true;
	}    //上
	if(isPutable(x, y, 1, 1, turn)){
		Reverse(x, y, 1, 1, turn);
		ret = true;
	}    //右下
	if(isPutable(x, y, -1, -1, turn)){
		Reverse(x, y, -1, -1, turn);
		ret = true;
	}    //左上
	if(isPutable(x, y, 1, -1, turn)){
		Reverse(x, y, 1, -1, turn);
		ret = true;
	}    //右上
	if(isPutable(x, y, -1, 1, turn)){
		Reverse(x, y, -1, 1, turn);
		ret = true;
	}    //左下

	return ret;
}